

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,ArrayElementRef *a)

{
  bool bVar1;
  Expression *pEVar2;
  Variable *pVVar3;
  int iVar4;
  Expression *pEVar5;
  ArrayElement *pAVar6;
  undefined4 extraout_var;
  Expression *args_2;
  undefined4 extraout_var_00;
  SliceRange SVar7;
  Type arrayOrVectorType;
  CodeLocation local_70;
  CodeLocation local_60;
  Type local_50;
  ArraySize local_38;
  ArraySize local_30;
  
  getArrayOrVectorType(&local_50,this,a);
  pEVar2 = (a->object).object;
  if (pEVar2 == (Expression *)0x0) {
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
  pEVar5 = evaluateAsExpression(this,pEVar2,&local_50);
  if (a->isSlice == true) {
    SVar7 = AST::ArrayElementRef::getResolvedSliceRange(a);
    pVVar3 = (this->currentTargetVariable).object;
    if (pVVar3 != (Variable *)0x0) {
      local_60.sourceCode.object =
           (a->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object;
      if (local_60.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_60.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_60.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_60.location.data =
           (a->super_Expression).super_Statement.super_ASTObject.context.location.location.data;
      local_38 = SVar7.end;
      local_30 = SVar7.start;
      pAVar6 = PoolAllocator::
               allocate<soul::heart::ArrayElement,soul::CodeLocation,soul::heart::Expression&,unsigned_long&,unsigned_long&>
                         (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_60,
                          pEVar5,&local_30,&local_38);
      iVar4 = (*(pVVar3->super_Expression).super_Object._vptr_Object[2])(pVVar3);
      pEVar5 = BlockBuilder::createCastIfNeeded
                         ((this->builder).super_BlockBuilder.module,&pAVar6->super_Expression,
                          (Type *)CONCAT44(extraout_var,iVar4));
      BlockBuilder::addAssignment
                (&(this->builder).super_BlockBuilder,&pVVar3->super_Expression,pEVar5);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.sourceCode.object);
    }
  }
  else {
    pEVar2 = (a->startIndex).object;
    if (pEVar2 == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    args_2 = evaluateAsExpression(this,pEVar2);
    pVVar3 = (this->currentTargetVariable).object;
    if (pVVar3 != (Variable *)0x0) {
      local_70.sourceCode.object =
           (a->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object;
      if (local_70.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_70.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_70.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_70.location.data =
           (a->super_Expression).super_Statement.super_ASTObject.context.location.location.data;
      bVar1 = a->suppressWrapWarning;
      pAVar6 = PoolAllocator::
               allocate<soul::heart::ArrayElement,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&>
                         (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_70,
                          pEVar5,args_2);
      pAVar6->isRangeTrusted = false;
      pAVar6->suppressWrapWarning = bVar1;
      iVar4 = (*(pVVar3->super_Expression).super_Object._vptr_Object[2])(pVVar3);
      pEVar5 = BlockBuilder::createCastIfNeeded
                         ((this->builder).super_BlockBuilder.module,&pAVar6->super_Expression,
                          (Type *)CONCAT44(extraout_var_00,iVar4));
      BlockBuilder::addAssignment
                (&(this->builder).super_BlockBuilder,&pVVar3->super_Expression,pEVar5);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_70.sourceCode.object);
    }
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_50.structure.object);
  return;
}

Assistant:

void visit (AST::ArrayElementRef& a) override
    {
        auto arrayOrVectorType = getArrayOrVectorType (a);
        auto& source = evaluateAsExpression (*a.object, arrayOrVectorType);

        if (a.isSlice)
        {
            auto sliceRange = a.getResolvedSliceRange();

            if (currentTargetVariable != nullptr)
                builder.addCastOrAssignment (*currentTargetVariable,
                                             builder.createFixedArraySlice (a.context.location,
                                                                            source, sliceRange.start, sliceRange.end));
            return;
        }

        auto& index = evaluateAsExpression (*a.startIndex);

        if (currentTargetVariable != nullptr)
            builder.addCastOrAssignment (*currentTargetVariable,
                                         builder.createDynamicSubElement (a.context.location, source, index,
                                                                          false, a.suppressWrapWarning));
    }